

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
CompactCovarianceBase<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimitedUncertainties,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (CompactCovarianceBase<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimitedUncertainties,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  undefined1 local_58 [48];
  
  local_58._24_8_ = *(undefined8 *)(this + 0x10);
  local_58._8_8_ = *(undefined8 *)(this + 0x18);
  local_58._1_7_ = 0;
  local_58[0] = this[0x68];
  local_58._16_8_ = 2;
  auVar1 = *(undefined1 (*) [16])this;
  local_58._40_4_ = auVar1._0_4_;
  local_58._32_8_ = auVar1._8_8_;
  local_58._44_4_ = auVar1._4_4_;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_58,it,MAT,MF,MT);
  if (this[0x68] ==
      (CompactCovarianceBase<njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimitedUncertainties,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited>
       )0x1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((ListRecord *)(this + 0x20),it,MAT,MF,MT);
  }
  CompactRMatrixLimitedUncertainties::print<std::back_insert_iterator<std::__cxx11::string>>
            ((CompactRMatrixLimitedUncertainties *)(this + 0x70),it,MAT,MF,MT);
  CompactCorrelationMatrix::print<std::back_insert_iterator<std::__cxx11::string>>
            ((CompactCorrelationMatrix *)(this + 0xd0),it,MAT,MF,MT);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->SPI(), this->AP(),
                 this->L1(), this->LCOMP(),
                 this->N1(), this->ISR() ).print( it, MAT, MF, MT );
  if ( this->ISR() ) {

    Derived::print( this->dap_.value(), it, MAT, MF, MT );
  }
  this->uncertainties_.print( it, MAT, MF, MT );
  this->matrix_.print( it, MAT, MF, MT );
}